

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Offset<const_MyGame::Example::Vec3_*> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<MyGame::Example::Vec3>
          (FlatBufferBuilderImpl<false> *this,Vec3 *structobj)

{
  NotNested(this);
  Align(this,8);
  vector_downward<unsigned_int>::push_small<MyGame::Example::Vec3>(&this->buf_,structobj);
  return (Offset<const_MyGame::Example::Vec3_*>)(this->buf_).size_;
}

Assistant:

Offset<const T *> CreateStruct(const T &structobj) {
    NotNested();
    Align(AlignOf<T>());
    buf_.push_small(structobj);
    return Offset<const T *>(
        CalculateOffset<typename Offset<const T *>::offset_type>());
  }